

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,EitherFlag *flag)

{
  bool bVar1;
  ostream *poVar2;
  ExtraError *this_00;
  string local_1b0;
  ostringstream problem;
  
  bVar1 = Matcher::Match(&this->matcher,flag);
  if (bVar1) {
    if ((((this->super_NamedBase).super_Base.options & Single) != None) &&
       ((this->super_NamedBase).super_Base.matched == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
      poVar2 = std::operator<<((ostream *)&problem,"Flag \'");
      EitherFlag::str_abi_cxx11_(&local_1b0,flag);
      poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
      std::operator<<(poVar2,"\' was passed multiple times, but is only allowed to be passed once");
      std::__cxx11::string::~string((string *)&local_1b0);
      this_00 = (ExtraError *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      ExtraError::ExtraError(this_00,&local_1b0);
      __cxa_throw(this_00,&ExtraError::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->super_NamedBase).super_Base.matched = true;
  }
  else {
    this = (FlagBase *)0x0;
  }
  return this;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                if (matcher.Match(flag))
                {
                    if ((GetOptions() & Options::Single) != Options::None && matched)
                    {
                        std::ostringstream problem;
                        problem << "Flag '" << flag.str() << "' was passed multiple times, but is only allowed to be passed once";
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
                        errorMsg = problem.str();
#else
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }